

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall google::LogMessage::LogStream::~LogStream(LogStream *this)

{
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)&PTR__LogStream_001396c0;
  *(undefined ***)&(this->super_ostream).field_0x58 = &PTR__LogStream_001396e8;
  *(code **)&(this->super_ostream).field_0x8 = __assert_fail;
  std::locale::~locale((locale *)&(this->super_ostream).field_0x40);
  std::ios_base::~ios_base((ios_base *)&(this->super_ostream).field_0x58);
  operator_delete(this,0x160);
  return;
}

Assistant:

class GOOGLE_GLOG_DLL_DECL LogStream : public std::ostream {
GLOG_MSVC_POP_WARNING()
  public:
    LogStream(char *buf, int len, int ctr)
        : std::ostream(NULL),
          streambuf_(buf, len),
          ctr_(ctr),
          self_(this) {
      rdbuf(&streambuf_);
    }

    int ctr() const { return ctr_; }
    void set_ctr(int ctr) { ctr_ = ctr; }
    LogStream* self() const { return self_; }

    // Legacy std::streambuf methods.
    size_t pcount() const { return streambuf_.pcount(); }
    char* pbase() const { return streambuf_.pbase(); }
    char* str() const { return pbase(); }

  private:
    LogStream(const LogStream&);
    LogStream& operator=(const LogStream&);
    base_logging::LogStreamBuf streambuf_;
    int ctr_;  // Counter hack (for the LOG_EVERY_X() macro)
    LogStream *self_;  // Consistency check hack
  }